

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode JsDiagGetFunctionPosition(JsValueRef function,JsValueRef *functionPosition)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  Utf8SourceInfo *utf8SourceInfo;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  uint startCharOfStatement;
  JsrtContext *currentContext;
  RecyclableObject *value;
  JavascriptLibrary *this;
  ParseableFunctionInfo *this_00;
  FunctionBody *this_01;
  DynamicObject *pDVar5;
  undefined4 *puVar6;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_78 [8];
  EnterScriptObject __enterScriptObject;
  ScriptFunction *jsFunction;
  ULONG firstStatementLine;
  ULONG local_3c;
  uint local_38;
  AutoNestedHandledExceptionType local_34;
  BOOL fParsed;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) {
    return JVar4;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_b8 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_78,scriptContext,(ScriptEntryExitRecord *)auStack_b8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_78);
  if (function != (JsValueRef)0x0) {
    if ((ulong)function >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(function);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b2b52;
        function = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (functionPosition == (JsValueRef *)0x0) {
      JVar4 = JsErrorNullArgument;
      goto LAB_003b2b52;
    }
    *functionPosition = (JsValueRef)0x0;
    bVar3 = Js::VarIs<Js::RecyclableObject>(function);
    if (bVar3) {
      bVar3 = Js::VarIs<Js::ScriptFunction>(function);
      JVar4 = JsErrorInvalidArgument;
      if (bVar3) {
        this = (JavascriptLibrary *)Js::VarTo<Js::ScriptFunction>(function);
        __enterScriptObject.library = this;
        this_00 = Js::JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
        bVar3 = Js::ParseableFunctionInfo::IsFunctionParsed(this_00);
        local_38 = (uint)bVar3;
        if ((bVar3) ||
           (Js::JavascriptFunction::DeferredParseCore
                      ((ScriptFunction **)&__enterScriptObject.library,(BOOL *)&local_38),
           this = __enterScriptObject.library, local_38 != 0)) {
          this_01 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
          JVar4 = JsErrorDiagObjectNotFound;
          if ((this_01 != (FunctionBody *)0x0) &&
             ((utf8SourceInfo =
                    (this_01->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
              utf8SourceInfo != (Utf8SourceInfo *)0x0 && ((utf8SourceInfo->field_0xa8 & 4) == 0))))
          {
            firstStatementLine =
                 Js::ParseableFunctionInfo::GetLineNumber(&this_01->super_ParseableFunctionInfo);
            local_3c = Js::ParseableFunctionInfo::GetColumnNumber
                                 (&this_01->super_ParseableFunctionInfo);
            startCharOfStatement = Js::FunctionBody::GetStatementStartOffset(this_01,0);
            bVar3 = Js::FunctionBody::GetLineCharOffsetFromStartChar
                              (this_01,startCharOfStatement,(ULONG *)&jsFunction,
                               (LONG *)((long)&jsFunction + 4),true);
            if (bVar3) {
              pSVar1 = (utf8SourceInfo->m_scriptContext).ptr;
              pDVar5 = Js::JavascriptLibrary::CreateObject
                                 ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0
                                 );
              pDVar5 = (DynamicObject *)Js::CrossSite::MarshalVar(pSVar1,pDVar5,false);
              if (pDVar5 != (DynamicObject *)0x0) {
                JsrtDebugUtils::AddScriptIdToObject(pDVar5,utf8SourceInfo);
                JsrtDebugUtils::AddFileNameOrScriptTypeToObject(pDVar5,utf8SourceInfo);
                JsrtDebugUtils::AddPropertyToObject
                          (pDVar5,(JsrtDebugPropertyId)0x10,firstStatementLine,scriptContext);
                JsrtDebugUtils::AddPropertyToObject
                          (pDVar5,(JsrtDebugPropertyId)0x3,local_3c,scriptContext);
                JsrtDebugUtils::AddPropertyToObject
                          (pDVar5,(JsrtDebugPropertyId)0xa,(uint32)jsFunction,scriptContext);
                JsrtDebugUtils::AddPropertyToObject
                          (pDVar5,(JsrtDebugPropertyId)0x9,jsFunction._4_4_,scriptContext);
                *functionPosition = pDVar5;
                JVar4 = JsNoError;
              }
            }
          }
        }
        else {
          JVar4 = JsErrorDiagObjectNotFound;
        }
      }
      goto LAB_003b2b52;
    }
  }
  JVar4 = JsErrorInvalidArgument;
LAB_003b2b52:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_78);
  if ((((JVar4 - JsErrorNoCurrentContext < 7) &&
       ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal))
     || (JVar4 == JsErrorScriptTerminated)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_34);
  return JVar4;
}

Assistant:

CHAKRA_API JsDiagGetFunctionPosition(
    _In_ JsValueRef function,
    _Out_ JsValueRef *functionPosition)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        VALIDATE_INCOMING_REFERENCE(function, scriptContext);
        PARAM_NOT_NULL(functionPosition);

        *functionPosition = JS_INVALID_REFERENCE;

        if (!Js::VarIs<Js::RecyclableObject>(function) || !Js::VarIs<Js::ScriptFunction>(function))
        {
            return JsErrorInvalidArgument;
        }

        Js::ScriptFunction* jsFunction = Js::VarTo<Js::ScriptFunction>(function);

        BOOL fParsed = jsFunction->GetParseableFunctionInfo()->IsFunctionParsed();
        if (!fParsed)
        {
            Js::JavascriptFunction::DeferredParseCore(&jsFunction, fParsed);
        }

        if (fParsed)
        {
            Js::FunctionBody* functionBody = jsFunction->GetFunctionBody();
            if (functionBody != nullptr)
            {
                Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();
                if (utf8SourceInfo != nullptr && !utf8SourceInfo->GetIsLibraryCode())
                {
                    ULONG lineNumber = functionBody->GetLineNumber();
                    ULONG columnNumber = functionBody->GetColumnNumber();
                    uint startOffset = functionBody->GetStatementStartOffset(0);
                    ULONG firstStatementLine;
                    LONG firstStatementColumn;

                    if (functionBody->GetLineCharOffsetFromStartChar(startOffset, &firstStatementLine, &firstStatementColumn))
                    {
                        Js::DynamicObject* funcPositionObject = (Js::DynamicObject*)Js::CrossSite::MarshalVar(utf8SourceInfo->GetScriptContext(), scriptContext->GetLibrary()->CreateObject());

                        if (funcPositionObject != nullptr)
                        {
                            JsrtDebugUtils::AddScriptIdToObject(funcPositionObject, utf8SourceInfo);
                            JsrtDebugUtils::AddFileNameOrScriptTypeToObject(funcPositionObject, utf8SourceInfo);
                            JsrtDebugUtils::AddPropertyToObject(funcPositionObject, JsrtDebugPropertyId::line, (uint32)lineNumber, scriptContext);
                            JsrtDebugUtils::AddPropertyToObject(funcPositionObject, JsrtDebugPropertyId::column, (uint32)columnNumber, scriptContext);
                            JsrtDebugUtils::AddPropertyToObject(funcPositionObject, JsrtDebugPropertyId::firstStatementLine, (uint32)firstStatementLine, scriptContext);
                            JsrtDebugUtils::AddPropertyToObject(funcPositionObject, JsrtDebugPropertyId::firstStatementColumn, (int32)firstStatementColumn, scriptContext);

                            *functionPosition = funcPositionObject;

                            return JsNoError;
                        }
                    }
                }
            }
        }

        return JsErrorDiagObjectNotFound;
    });
#endif
}